

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

TileJobsDec * get_dec_job_info(AV1DecTileMT *tile_mt_info)

{
  int iVar1;
  TileJobsDec *pTVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)tile_mt_info->job_mutex);
  iVar1 = tile_mt_info->jobs_dequeued;
  if (iVar1 < tile_mt_info->jobs_enqueued) {
    pTVar2 = tile_mt_info->job_queue + iVar1;
    tile_mt_info->jobs_dequeued = iVar1 + 1;
  }
  else {
    pTVar2 = (TileJobsDec *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)tile_mt_info->job_mutex);
  return pTVar2;
}

Assistant:

static TileJobsDec *get_dec_job_info(AV1DecTileMT *tile_mt_info) {
  TileJobsDec *cur_job_info = NULL;
#if CONFIG_MULTITHREAD
  pthread_mutex_lock(tile_mt_info->job_mutex);

  if (tile_mt_info->jobs_dequeued < tile_mt_info->jobs_enqueued) {
    cur_job_info = tile_mt_info->job_queue + tile_mt_info->jobs_dequeued;
    tile_mt_info->jobs_dequeued++;
  }

  pthread_mutex_unlock(tile_mt_info->job_mutex);
#else
  (void)tile_mt_info;
#endif
  return cur_job_info;
}